

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPController.cpp
# Opt level: O2

ssize_t __thiscall
TCPController::recv(TCPController *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ushort uVar1;
  undefined8 uVar2;
  ssize_t sVar3;
  mapped_type *pmVar4;
  iterator iVar5;
  __shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ostream *poVar7;
  ssize_t extraout_RAX;
  int fd;
  uint8_t *data;
  shared_lock<std::shared_mutex> lck;
  mapped_type conn;
  mapped_type local_54;
  undefined1 local_50 [32];
  uint8_t local_30;
  __shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  sVar3 = IPController::recv((IPController *)local_50,(int)this->ip_ctrl,__buf,__n,__flags);
  uVar2 = local_50._0_8_;
  if (((Ethernet *)local_50._0_8_ != (Ethernet *)0x0) &&
     ((NetworkDevice *)local_50._16_8_ != (NetworkDevice *)0x0)) {
    local_30 = '\x01';
    local_50._24_8_ = this;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
    uVar1 = *(ushort *)((long)(_func_int ***)uVar2 + 2);
    local_28._M_ptr._0_2_ = uVar1 << 8 | uVar1 >> 8;
    pmVar4 = std::__detail::
             _Map_base<unsigned_short,_std::pair<const_unsigned_short,_int>,_std::allocator<std::pair<const_unsigned_short,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_int>,_std::allocator<std::pair<const_unsigned_short,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->port_fd_map,(key_type *)&local_28);
    local_54 = *pmVar4;
    iVar5 = std::
            _Hashtable<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->connections)._M_h,&local_54);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_false>.
        _M_cur == (__node_type *)0x0) {
      poVar7 = std::operator<<((ostream *)&std::cout,"not found port");
      uVar1 = *(ushort *)((long)(_func_int ***)uVar2 + 2);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar1 << 8 | uVar1 >> 8);
      std::endl<char,std::char_traits<char>>(poVar7);
      TCPConnection::recv(&this->dummy_connection,local_50._0_4_,(void *)local_50._16_8_,
                          (ulong)(uint)local_50._12_4_,__flags);
    }
    else {
      p_Var6 = &std::__detail::
                _Map_base<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->connections,&local_54)->
                super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_28,p_Var6);
      std::shared_lock<std::shared_mutex>::unlock
                ((shared_lock<std::shared_mutex> *)(local_50 + 0x18));
      TCPConnection::recv((TCPConnection *)CONCAT62(local_28._M_ptr._2_6_,(ushort)local_28._M_ptr),
                          local_50._0_4_,(void *)local_50._16_8_,(ulong)(uint)local_50._12_4_,
                          __flags);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    }
    std::shared_lock<std::shared_mutex>::~shared_lock
              ((shared_lock<std::shared_mutex> *)(local_50 + 0x18));
    sVar3 = extraout_RAX;
  }
  return sVar3;
}

Assistant:

void TCPController::recv() {
    auto[data, protocol, from_ip, size] = ip_ctrl.recv();
    if (data != nullptr && size != 0) {
        auto *tcp = (tcp_t *) data;
        std::shared_lock lck(mutex_);
        int fd = port_fd_map[ntohs(tcp->dst_port)];
        if (connections.find(fd) != connections.end()) {
            auto conn = connections[fd];
            lck.unlock();
            conn->recv(data, size, from_ip);
        } else {
            std::cout << "not found port" << ntohs(tcp->dst_port) << std::endl;
            dummy_connection.recv(data, size, from_ip);
        }
    }
}